

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Samplers::FunctionalTest::prepareProgram(FunctionalTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  int *piVar8;
  undefined4 *puVar9;
  MessageBuilder *pMVar10;
  bool bVar11;
  int *piVar12;
  char **value;
  GLint status_1;
  GLint status;
  GLint log_size;
  GLchar *log_text_1;
  Shader shader [2];
  int local_1fc;
  undefined8 local_1f8;
  int local_1ec;
  Enum<int,_2UL> local_1e8;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  int iStack_1cc;
  char *local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  piVar12 = &iStack_1cc;
  local_1c8 = 
  "#version 330\n\nuniform sampler2D texture_sampler;\n\nout vec4 color;\n\nvoid main()\n{\n    color = texture(texture_sampler, vec2(0.33333, 0.33333));\n}\n"
  ;
  uStack_1c0 = 0x8b30;
  local_1d8 = 0x1ac83c0;
  uStack_1d4 = 0;
  uStack_1d0 = 0x8b31;
  iStack_1cc = 0;
  GVar4 = (**(code **)(lVar7 + 0x3c8))();
  this->m_po = GVar4;
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x26b);
  value = (char **)&local_1d8;
  bVar2 = true;
  do {
    bVar11 = bVar2;
    if (*value != (char *)0x0) {
      uVar6 = (**(code **)(lVar7 + 0x3f0))(*(undefined4 *)(value + 1));
      *(undefined4 *)((long)value + 0xc) = uVar6;
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glCreateShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                      ,0x275);
      (**(code **)(lVar7 + 0x10))(this->m_po,*(undefined4 *)((long)value + 0xc));
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glAttachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                      ,0x279);
      (**(code **)(lVar7 + 0x12b8))(*(undefined4 *)((long)value + 0xc),1,value,0);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glShaderSource call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                      ,0x27d);
      (**(code **)(lVar7 + 0x248))(*(undefined4 *)((long)value + 0xc));
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glCompileShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                      ,0x281);
      local_1fc = 0;
      (**(code **)(lVar7 + 0xa70))(*(undefined4 *)((long)value + 0xc),0x8b81,&local_1fc);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                      ,0x286);
      if (local_1fc == 0) {
        local_1ec = 0;
        (**(code **)(lVar7 + 0xa70))(*(undefined4 *)((long)value + 0xc),0x8b84);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glGetShaderiv call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                        ,0x28c);
        iVar3 = local_1ec;
        local_1f8 = (char *)operator_new__((long)local_1ec);
        (**(code **)(lVar7 + 0xa58))(*(undefined4 *)((long)value + 0xc),iVar3,0,local_1f8);
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Shader compilation has failed.\n",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Shader type: ",0xd);
        local_1e8.m_value = *(int *)(value + 1);
        local_1e8.m_getName = glu::getShaderTypeName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Shader compilation error log:\n",0x1e);
        pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                   "Shader source code:\n",0x14);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        if (local_1f8 != (char *)0x0) {
          operator_delete__(local_1f8);
        }
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glGetShaderInfoLog call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                        ,0x29d);
        puVar9 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar9 = 0;
        __cxa_throw(puVar9,&int::typeinfo,0);
      }
    }
    value = &local_1c8;
    bVar2 = false;
  } while (bVar11);
  (**(code **)(lVar7 + 0xce8))(this->m_po);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x2a7);
  local_1f8 = (char *)((ulong)local_1f8._4_4_ << 0x20);
  (**(code **)(lVar7 + 0x9d8))(this->m_po,0x8b82);
  if ((int)local_1f8 == 1) {
    piVar8 = piVar12;
    bVar2 = true;
    do {
      bVar11 = bVar2;
      if (*piVar8 != 0) {
        (**(code **)(lVar7 + 0x4e0))(this->m_po);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glDetachShader call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                        ,0x2b5);
      }
      piVar8 = (int *)((long)&uStack_1c0 + 4);
      bVar2 = false;
    } while (bVar11);
    bVar2 = true;
    do {
      bVar11 = bVar2;
      if (*piVar12 != 0) {
        (**(code **)(lVar7 + 0x470))();
        *piVar12 = 0;
      }
      piVar12 = (int *)((long)&uStack_1c0 + 4);
      bVar2 = false;
    } while (bVar11);
    if (this->m_po != 0) {
      (**(code **)(lVar7 + 0x1680))();
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glUseProgram call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                      ,0x2e7);
      if (this->m_po != 0) {
        return;
      }
    }
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 0;
    __cxa_throw(puVar9,&int::typeinfo,0);
  }
  local_1fc = 0;
  (**(code **)(lVar7 + 0x9d8))(this->m_po,0x8b84);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glGetProgramiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x2bf);
  iVar3 = local_1fc;
  local_1e8.m_getName = (GetNameFunc)operator_new__((long)local_1fc);
  (**(code **)(lVar7 + 0x988))(this->m_po,iVar3,0,local_1e8.m_getName);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Program linkage has failed due to:\n",0x23);
  pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>
            (&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (local_1e8.m_getName != (GetNameFunc)0x0) {
    operator_delete__(local_1e8.m_getName);
  }
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glGetProgramInfoLog call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x2cb);
  puVar9 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar9 = 0;
  __cxa_throw(puVar9,&int::typeinfo,0);
}

Assistant:

void FunctionalTest::prepareProgram()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* const source;
		glw::GLenum const		 type;
		glw::GLuint				 id;
	} shader[] = { { s_vertex_shader, GL_VERTEX_SHADER, 0 }, { s_fragment_shader, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		m_po = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			if (DE_NULL != shader[i].source)
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(m_po, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, 1, &(shader[i].source), NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader compilation has failed.\n"
														<< "Shader type: " << glu::getShaderTypeStr(shader[i].type)
														<< "\n"
														<< "Shader compilation error log:\n"
														<< log_text << "\n"
														<< "Shader source code:\n"
														<< shader[i].source << "\n"
														<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Link. */
		gl.linkProgram(m_po);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(m_po, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(m_po, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(m_po, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(m_po, log_size, NULL, &log_text[0]);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Program linkage has failed due to:\n"
												<< log_text << "\n"
												<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (m_po)
		{
			gl.deleteProgram(m_po);

			m_po = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (m_po)
	{
		gl.useProgram(m_po);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");
	}

	if (0 == m_po)
	{
		throw 0;
	}
}